

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dorpi.cpp
# Opt level: O0

void __thiscall numerary::TestDorpi::test_dorpi::test_method(test_dorpi *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  double *y_00;
  lazy_ostream *plVar3;
  basic_cstring<const_char> local_148;
  basic_cstring<const_char> local_138;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_128;
  assertion_result local_108;
  basic_cstring<const_char> local_f0;
  basic_cstring<const_char> local_e0;
  basic_cstring<const_char> local_d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_c0;
  basic_cstring<const_char> local_98;
  basic_cstring<const_char> local_88 [2];
  allocator<char> local_61;
  string local_60;
  short local_3c [2];
  short result;
  double dStack_38;
  short expected_result;
  double expected_answer;
  double h;
  double x;
  double x0;
  double *y;
  test_dorpi *this_local;
  
  y = (double *)this;
  y_00 = (double *)operator_new__(0x10);
  x = 1.0;
  *y_00 = 3.0;
  h = 2.0;
  local_3c[1] = 0;
  dStack_38 = 36.0;
  x0 = (double)y_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"dorpi_4_5",&local_61);
  local_3c[0] = Numerary::ordinary_differential_equations
                          (test_dorpi_function_1,y_00,1.0,expected_answer,2.0,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_88,
               "/workspace/llm4binary/github/license_c_cmakelists/tivole[P]Numerary/test/test_dorpi.cpp"
               ,0x57);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_98);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,local_88,0x20,&local_98);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_c0,plVar3,(char (*) [1])0x29dec0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/tivole[P]Numerary/test/test_dorpi.cpp"
               ,0x57);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,short,short>
              (&local_c0,&local_d0,0x20,1,2,local_3c,"result",local_3c + 1,"expected_result");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_c0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e0,
               "/workspace/llm4binary/github/license_c_cmakelists/tivole[P]Numerary/test/test_dorpi.cpp"
               ,0x57);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_e0,0x22,&local_f0);
    boost::test_tools::assertion_result::assertion_result
              (&local_108,ABS(dStack_38 - *(double *)((long)x0 + 8)) < 0.0001);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_138,"fabs(expected_answer - y[1]) < 1.e-4",0x24);
    boost::unit_test::operator<<(&local_128,plVar3,&local_138);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_148,
               "/workspace/llm4binary/github/license_c_cmakelists/tivole[P]Numerary/test/test_dorpi.cpp"
               ,0x57);
    boost::test_tools::tt_detail::report_assertion
              (&local_108,&local_128.super_lazy_ostream,&local_148,0x22,CHECK,CHECK_PRED,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_128);
    boost::test_tools::assertion_result::~assertion_result(&local_108);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  if (x0 != 0.0) {
    operator_delete__((void *)x0);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_dorpi)
    {
        double *y = new double[2];
        double x0, x, h, expected_answer;
        short int expected_result, result;

        // Initial points
        x0 = 1; y[0] = 3;

        x = 2.0;

        expected_result = 0;
        expected_answer = 36;
        result = Numerary::ordinary_differential_equations(test_dorpi_function_1, y, x0, h, x, "dorpi_4_5");
        BOOST_CHECK_EQUAL(result, expected_result);

        BOOST_CHECK(fabs(expected_answer - y[1]) < 1.e-4);

        delete[] y;
    }